

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_min_s_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float32 fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float32 fVar6;
  int iVar7;
  
  lVar3 = (ulong)wd * 0x10;
  lVar5 = (ulong)ws * 0x10;
  lVar4 = (ulong)wt * 0x10;
  fVar1 = (env->active_fpu).fpr[ws].fs[0];
  fVar6 = (env->active_fpu).fpr[wt].fs[0];
  if ((int)fVar1 < (int)fVar6) {
    fVar6 = fVar1;
  }
  (env->active_fpu).fpr[wd].fs[0] = fVar6;
  iVar2 = *(int *)((long)(env->active_fpu).fpr + lVar5 + 4);
  iVar7 = *(int *)((long)(env->active_fpu).fpr + lVar4 + 4);
  if (iVar2 < iVar7) {
    iVar7 = iVar2;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar3 + 4) = iVar7;
  iVar2 = *(int *)((long)(env->active_fpu).fpr + lVar5 + 8);
  iVar7 = *(int *)((long)(env->active_fpu).fpr + lVar4 + 8);
  if (iVar2 < iVar7) {
    iVar7 = iVar2;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar3 + 8) = iVar7;
  iVar2 = *(int *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  iVar7 = *(int *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  if (iVar2 < iVar7) {
    iVar7 = iVar2;
  }
  *(int *)((long)(env->active_fpu).fpr + lVar3 + 0xc) = iVar7;
  return;
}

Assistant:

void helper_msa_min_s_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_min_s_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_min_s_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_min_s_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_min_s_df(DF_WORD, pws->w[3],  pwt->w[3]);
}